

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

int nghttp2_frame_pack_push_promise
              (nghttp2_bufs *bufs,nghttp2_push_promise *frame,nghttp2_hd_deflater *deflater)

{
  nghttp2_buf_chain *pnVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  
  pnVar1 = bufs->cur;
  if (bufs->head == pnVar1) {
    puVar4 = (pnVar1->buf).pos + 4;
    (pnVar1->buf).pos = puVar4;
    (pnVar1->buf).last = puVar4;
    iVar2 = nghttp2_hd_deflate_hd_bufs(deflater,bufs,frame->nva,frame->nvlen);
    iVar3 = -0x20b;
    if (iVar2 != -0x1f6) {
      iVar3 = iVar2;
    }
    puVar4 = (pnVar1->buf).pos + -4;
    (pnVar1->buf).pos = puVar4;
    if (iVar3 == 0) {
      nghttp2_put_uint32be(puVar4,frame->promised_stream_id);
      frame->padlen = 0;
      sVar5 = nghttp2_bufs_len(bufs);
      (frame->hd).length = sVar5;
      frame_pack_headers_shared(bufs,&frame->hd);
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("bufs->head == bufs->cur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x237,
                "int nghttp2_frame_pack_push_promise(nghttp2_bufs *, nghttp2_push_promise *, nghttp2_hd_deflater *)"
               );
}

Assistant:

int nghttp2_frame_pack_push_promise(nghttp2_bufs *bufs,
                                    nghttp2_push_promise *frame,
                                    nghttp2_hd_deflater *deflater) {
  size_t nv_offset = 4;
  int rv;
  nghttp2_buf *buf;

  assert(bufs->head == bufs->cur);

  buf = &bufs->cur->buf;

  buf->pos += nv_offset;
  buf->last = buf->pos;

  /* This call will adjust buf->last to the correct position */
  rv = nghttp2_hd_deflate_hd_bufs(deflater, bufs, frame->nva, frame->nvlen);

  if (rv == NGHTTP2_ERR_BUFFER_ERROR) {
    rv = NGHTTP2_ERR_HEADER_COMP;
  }

  buf->pos -= nv_offset;

  if (rv != 0) {
    return rv;
  }

  nghttp2_put_uint32be(buf->pos, (uint32_t)frame->promised_stream_id);

  frame->padlen = 0;
  frame->hd.length = nghttp2_bufs_len(bufs);

  return frame_pack_headers_shared(bufs, &frame->hd);
}